

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test>
::CreateTest(TestFactoryImpl<google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionCordAccessorsTest_GetOneofCord_Test>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(1000);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__GeneratedMessageReflectionCordAccessorsTest_018f8908;
  proto2_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)&this_00[6].gtest_flag_saver_,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)(this_00 + 0x3b),(Arena *)0x0);
  this_00->_vptr_Test = (_func_int **)&PTR__GeneratedMessageReflectionCordAccessorsTest_018f8988;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }